

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall pbrt::ParsedScene::ObjectEnd(ParsedScene *this,FileLoc loc)

{
  pointer ppVar1;
  long in_FS_OFFSET;
  char vb;
  char va;
  
  if (this->currentBlock == OptionsBlock) {
    ErrorExit<char_const(&)[10]>
              (&loc,"Scene description must be inside world block; \"%s\" is not allowed.",
               (char (*) [10])0x431931);
  }
  if (this->currentInstance == (InstanceDefinitionSceneEntity *)0x0) {
    (this->super_SceneRepresentation).errorExit = true;
    Error(&loc,"ObjectEnd called outside of instance definition");
  }
  else {
    this->currentInstance = (InstanceDefinitionSceneEntity *)0x0;
    GraphicsState::operator=
              (&this->graphicsState,
               (this->pushedGraphicsStates).
               super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1);
    std::vector<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
    ::pop_back(&this->pushedGraphicsStates);
    *(long *)(in_FS_OFFSET + -0x5f8) = *(long *)(in_FS_OFFSET + -0x5f8) + 1;
    ppVar1 = (this->pushStack).
             super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    va = ppVar1[-1].first;
    if (va == 'a') {
      (this->super_SceneRepresentation).errorExit = true;
      Error<pbrt::FileLoc&>
                (&loc,"Mismatched nesting: open AttributeBegin from %s at ObjectEnd",
                 &ppVar1[-1].second);
      ppVar1 = (this->pushStack).
               super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      vb = 'o';
      if (va != 'o') {
        LogFatal<char_const(&)[23],char_const(&)[4],char_const(&)[23],char&,char_const(&)[4],char&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp"
                   ,0x15b,"Check failed: %s == %s with %s = %s, %s = %s",
                   (char (*) [23])"pushStack.back().first",(char (*) [4])"\'o\'",
                   (char (*) [23])"pushStack.back().first",&va,(char (*) [4])"\'o\'",&vb);
      }
    }
    (this->pushStack).
    super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar1 + -1;
  }
  return;
}

Assistant:

void ParsedScene::ObjectEnd(FileLoc loc) {
    VERIFY_WORLD("ObjectEnd");
    if (currentInstance == nullptr) {
        ErrorExitDeferred(&loc, "ObjectEnd called outside of instance definition");
        return;
    }
    currentInstance = nullptr;

    // NOTE: Must keep the following consistent with AttributeEnd
    graphicsState = std::move(pushedGraphicsStates.back());
    pushedGraphicsStates.pop_back();

    ++nObjectInstancesCreated;

    if (pushStack.back().first == 'a')
        ErrorExitDeferred(&loc,
                          "Mismatched nesting: open AttributeBegin from %s at ObjectEnd",
                          pushStack.back().second);
    else
        CHECK_EQ(pushStack.back().first, 'o');
    pushStack.pop_back();
}